

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlwriter.c
# Opt level: O1

int xmlTextWriterCloseDocCallback(void *context)

{
  int int1;
  int iVar1;
  
  iVar1 = 0;
  int1 = xmlParseChunk((xmlParserCtxtPtr)context,(char *)0x0,0,1);
  if (int1 != 0) {
    xmlRaiseError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,(void *)0x0,
                  (xmlNode *)0x0,0x19,1,XML_ERR_FATAL,(char *)0x0,0,(char *)0x0,(char *)0x0,
                  (char *)0x0,int1,0,"xmlTextWriterCloseDocCallback : XML error %d !\n",int1);
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

static int
xmlTextWriterCloseDocCallback(void *context)
{
    xmlParserCtxtPtr ctxt = (xmlParserCtxtPtr) context;
    int rc;

    rc = xmlParseChunk(ctxt, NULL, 0, 1);
    if (rc != 0) {
        xmlWriterErrMsgInt(NULL, XML_ERR_INTERNAL_ERROR,
                        "xmlTextWriterCloseDocCallback : XML error %d !\n",
                        rc);
        return -1;
    }

    return 0;
}